

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError parse_args(GlobalConfig *global,int argc,char **argv)

{
  GlobalConfig *pGVar1;
  int iVar2;
  OperationConfig *pOVar3;
  char *pcVar4;
  char *nextarg;
  ParameterError error;
  int iVar5;
  OperationConfig *config;
  bool bVar6;
  _Bool passarg;
  _Bool used;
  _Bool local_4e;
  _Bool local_4d;
  uint local_4c;
  GlobalConfig *local_48;
  char **local_40;
  int local_34;
  
  config = global->first;
  local_48 = global;
  local_40 = argv;
  if (argc < 2) {
    bVar6 = true;
    nextarg = (char *)0x0;
    error = PARAM_OK;
  }
  else {
    local_34 = argc + -1;
    iVar5 = 1;
    local_4c = (uint)CONCAT71((uint7)(uint3)((uint)local_34 >> 8),1);
    error = PARAM_OK;
    do {
      nextarg = local_40[iVar5];
      if (nextarg == (char *)0x0) {
        return PARAM_NO_MEM;
      }
      if (((local_4c & 1) == 0) || (*nextarg != '-')) {
        error = getparameter("--url",nextarg,(char *)0x0,(char *)0x0,&local_4d,local_48,config);
      }
      else {
        iVar2 = strcmp("--",nextarg);
        pGVar1 = local_48;
        bVar6 = true;
        if (iVar2 == 0) {
          local_4c = 0;
        }
        else {
          if (iVar5 < local_34) {
            pcVar4 = local_40[(long)iVar5 + 1];
            if (pcVar4 == (char *)0x0) {
              bVar6 = false;
              goto LAB_0011354a;
            }
          }
          else {
            pcVar4 = (char *)0x0;
          }
          error = getparameter(nextarg,pcVar4,nextarg,local_40[(long)iVar5 + 1],&local_4e,local_48,
                               config);
          config = pGVar1->last;
          if (error == PARAM_OK) {
            iVar2 = iVar5 + 1;
            if (local_4e == false) {
              iVar2 = iVar5;
            }
            iVar5 = iVar2;
            error = PARAM_OK;
          }
          else {
            bVar6 = true;
            if (error != PARAM_NEXT_OPERATION) goto LAB_0011354a;
            if ((config->url_list == (getout *)0x0) || (config->url_list->url == (char *)0x0)) {
              errorf(local_48,"missing URL before --next");
              error = PARAM_BAD_USE;
            }
            else {
              pOVar3 = (OperationConfig *)malloc(0x4f0);
              config->next = pOVar3;
              if (pOVar3 == (OperationConfig *)0x0) {
                error = PARAM_NO_MEM;
              }
              else {
                config_init(pOVar3);
                pOVar3 = config->next;
                pOVar3->global = local_48;
                local_48->last = pOVar3;
                pOVar3->prev = config;
                error = PARAM_OK;
                config = pOVar3;
              }
            }
          }
          bVar6 = true;
        }
LAB_0011354a:
        if (!bVar6) {
          return PARAM_NO_MEM;
        }
      }
      iVar5 = iVar5 + 1;
      bVar6 = error == PARAM_OK;
    } while ((iVar5 < argc) && (error == PARAM_OK));
  }
  if ((bVar6) &&
     ((error = PARAM_OK, (config->field_0x4ec & 1) != 0 &&
      (error = PARAM_CONTDISP_RESUME_FROM, (config->field_0x4e4 & 0x20) == 0)))) {
    error = PARAM_OK;
  }
  if ((error < PARAM_GOT_EXTRA_PARAMETER) &&
     ((0x3e1U >> (error & (PARAM_VAR_SYNTAX|PARAM_VERSION_INFO_REQUESTED)) & 1) != 0)) {
    error = (&DAT_0012314c)[error];
  }
  else {
    pcVar4 = param2text(error);
    if ((nextarg == (char *)0x0) || (iVar5 = strcmp(":",nextarg), iVar5 == 0)) {
      helpf(tool_stderr,"%s",pcVar4);
    }
    else {
      helpf(tool_stderr,"option %s: %s",nextarg,pcVar4);
    }
  }
  return error;
}

Assistant:

ParameterError parse_args(struct GlobalConfig *global, int argc,
                          argv_item_t argv[])
{
  int i;
  bool stillflags;
  const char *orig_opt = NULL;
  ParameterError result = PARAM_OK;
  struct OperationConfig *config = global->first;

  for(i = 1, stillflags = TRUE; i < argc && !result; i++) {
    orig_opt = convert_tchar_to_UTF8(argv[i]);
    if(!orig_opt)
      return PARAM_NO_MEM;

    if(stillflags && ('-' == orig_opt[0])) {
      bool passarg;

      if(!strcmp("--", orig_opt))
        /* This indicates the end of the flags and thus enables the
           following (URL) argument to start with -. */
        stillflags = FALSE;
      else {
        const char *nextarg = NULL;
        if(i < (argc - 1)) {
          nextarg = convert_tchar_to_UTF8(argv[i + 1]);
          if(!nextarg) {
            unicodefree(orig_opt);
            return PARAM_NO_MEM;
          }
        }

        result = getparameter(orig_opt, nextarg, argv[i], argv[i + 1],
                              &passarg, global, config);

        unicodefree(nextarg);
        config = global->last;
        if(result == PARAM_NEXT_OPERATION) {
          /* Reset result as PARAM_NEXT_OPERATION is only used here and not
             returned from this function */
          result = PARAM_OK;

          if(config->url_list && config->url_list->url) {
            /* Allocate the next config */
            config->next = malloc(sizeof(struct OperationConfig));
            if(config->next) {
              /* Initialise the newly created config */
              config_init(config->next);

              /* Set the global config pointer */
              config->next->global = global;

              /* Update the last config pointer */
              global->last = config->next;

              /* Move onto the new config */
              config->next->prev = config;
              config = config->next;
            }
            else
              result = PARAM_NO_MEM;
          }
          else {
            errorf(global, "missing URL before --next");
            result = PARAM_BAD_USE;
          }
        }
        else if(!result && passarg)
          i++; /* we are supposed to skip this */
      }
    }
    else {
      bool used;

      /* Just add the URL please */
      result = getparameter("--url", orig_opt, NULL, NULL,
                            &used, global, config);
    }

    if(!result)
      unicodefree(orig_opt);
  }

  if(!result && config->content_disposition) {
    if(config->resume_from_current)
      result = PARAM_CONTDISP_RESUME_FROM;
  }

  if(result && result != PARAM_HELP_REQUESTED &&
     result != PARAM_MANUAL_REQUESTED &&
     result != PARAM_VERSION_INFO_REQUESTED &&
     result != PARAM_ENGINES_REQUESTED &&
     result != PARAM_CA_EMBED_REQUESTED) {
    const char *reason = param2text(result);

    if(orig_opt && strcmp(":", orig_opt))
      helpf(tool_stderr, "option %s: %s", orig_opt, reason);
    else
      helpf(tool_stderr, "%s", reason);
  }

  unicodefree(orig_opt);
  return result;
}